

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

int use_container(obj *obj,int held)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  obj **ppoVar6;
  long lVar7;
  char *pcVar8;
  char *planB;
  size_t sVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  obj *poVar13;
  uint uVar14;
  char *pcVar15;
  obj *poVar16;
  long amount;
  int selection [1];
  char menuprompt [256];
  char emptymsg [256];
  char qbuf [256];
  nh_menuitem items [3];
  uint local_76c;
  int local_764;
  char *local_760;
  char local_758 [256];
  char local_658 [8];
  undefined1 auStack_650 [248];
  char local_558 [256];
  char local_458 [256];
  nh_menuitem local_358 [3];
  
  local_558[0] = '\0';
  if (((youmonst.data)->mflags1 & 0x2000) == 0) {
    iVar4 = freehand();
    if (iVar4 == 0) {
      pcVar15 = body_part(6);
      pline("You have no free %s.",pcVar15);
      return 0;
    }
    if (obj == &zeroobj) {
LAB_00212db4:
      local_76c = 0;
      pcVar15 = "";
      current_container = obj;
    }
    else {
      if ((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) {
        pcVar15 = Tobjnam(obj,"seem");
        pline("%s to be locked.",pcVar15);
        if (held == 0) {
          return 0;
        }
        pcVar15 = "You must put it down to unlock.";
        goto LAB_00212d7b;
      }
      if ((short)*(uint *)&obj->field_0x4a < 0) {
        if (held != 0) {
          pcVar15 = xname(obj);
          pcVar15 = the(pcVar15);
          pline("You open %s...",pcVar15);
        }
        chest_trap(obj,6,'\0');
        if (multi < 0) {
          return 1;
        }
        nomul(-1,"opening a trapped container");
        nomovemsg = "";
        return 1;
      }
      if (obj->spe != '\x01') goto LAB_00212db4;
      current_container = obj;
      observe_quantum_cat(obj);
      local_76c = 1;
      pcVar15 = "now ";
    }
    if (obj == &zeroobj) {
      ppoVar6 = &magic_chest_objs;
    }
    else {
      ppoVar6 = &obj->cobj;
    }
    uVar14 = 0;
    if (*ppoVar6 == (obj *)0x0) {
      amount = 0;
    }
    else {
      amount = 0;
      poVar13 = *ppoVar6;
      local_760 = pcVar15;
      do {
        poVar16 = poVar13->nobj;
        if ((((obj == &zeroobj) || ((obj->otyp & 0xfffeU) != 0xe0)) || ((obj->field_0x4a & 1) == 0))
           || (uVar5 = mt_random(), 0x13b13b13 < uVar5 * -0x3b13b13b)) {
          uVar14 = uVar14 + 1;
        }
        else {
          obj_extract_self(poVar13);
          lVar7 = mbag_item_gone(held,poVar13);
          amount = amount + lVar7;
          local_76c = 1;
        }
        poVar13 = poVar16;
      } while (poVar16 != (obj *)0x0);
      uVar14 = (uint)(uVar14 != 0);
    }
    if (amount != 0) {
      pcVar15 = currency(amount);
      pline("You owe %ld %s for lost merchandise.",amount,pcVar15);
    }
    if (obj != &zeroobj) {
      uVar5 = weight(obj);
      obj->owt = uVar5;
    }
    bVar10 = (byte)uVar14;
    if (bVar10 == 0) {
      if (obj == &zeroobj) {
        pcVar15 = "The magic chest";
      }
      else {
        pcVar15 = Yname2(obj);
      }
      sprintf(local_558,"%s is %sempty.",pcVar15);
    }
    if ((flags.menu_style == '\x03' | bVar10) == 1) {
      builtin_strncpy(local_458,"Do you want to take something out of ",0x26);
      pcVar15 = eos(local_458);
      if (obj == &zeroobj) {
        builtin_strncpy(pcVar15,"the magic chest?",0x11);
      }
      else {
        pcVar8 = yname(obj);
        planB = ysimple_name(obj);
        pcVar8 = safe_qbuf(local_458,1,pcVar8,planB,"it");
        sprintf(pcVar15,"%s?",pcVar8);
      }
      poVar13 = invent;
      if (flags.menu_style == '\x03') {
        if (invent == (obj *)0x0 && bVar10 == 0) {
          bVar10 = 0;
          pline("%s",local_558);
          pline("You don\'t have anything to put in.");
          bVar2 = false;
          bVar1 = false;
          poVar16 = (obj *)(ulong)local_76c;
        }
        else {
          local_658[0] = '\0';
          if (bVar10 == 0) {
            sprintf(local_658,"%s ",local_558);
          }
          sVar9 = strlen(local_658);
          poVar16 = current_container;
          builtin_strncpy(local_658 + sVar9,"Do what?",8);
          auStack_650[sVar9] = 0;
          uVar11 = 0;
          if (bVar10 != 0) {
            if (current_container == &zeroobj) {
              builtin_strncpy(local_758,"Take something out of the magic chest",0x26);
            }
            else {
              pcVar15 = xname(current_container);
              pcVar15 = the(pcVar15);
              sprintf(local_758,"Take something out of %s",pcVar15);
            }
            local_358[0].id = 1;
            local_358[0].role = MI_NORMAL;
            local_358[0].accel = 'o';
            local_358[0].group_accel = '\0';
            local_358[0].selected = '\0';
            strcpy(local_358[0].caption,local_758);
            uVar11 = 1;
          }
          uVar12 = uVar11;
          if (poVar13 != (obj *)0x0) {
            if (poVar16 == &zeroobj) {
              builtin_strncpy(local_758,"Put something into the magic chest",0x23);
            }
            else {
              pcVar15 = xname(poVar16);
              pcVar15 = the(pcVar15);
              sprintf(local_758,"Put something into %s",pcVar15);
            }
            uVar12 = (ulong)((int)uVar11 + 1);
            local_358[uVar11].id = 2;
            local_358[uVar11].role = MI_NORMAL;
            local_358[uVar11].accel = 'i';
            local_358[uVar11].group_accel = '\0';
            local_358[uVar11].selected = '\0';
            strcpy(local_358[uVar11].caption,local_758);
          }
          iVar4 = (int)uVar12;
          if (bVar10 == 1 && poVar13 != (obj *)0x0) {
            iVar4 = iVar4 + 1;
            local_358[uVar12].id = 3;
            local_358[uVar12].role = MI_NORMAL;
            local_358[uVar12].accel = 'b';
            local_358[uVar12].group_accel = '\0';
            local_358[uVar12].selected = '\0';
            builtin_strncpy(local_358[uVar12].caption,"Both of ",8);
            builtin_strncpy(local_358[uVar12].caption + 8,"the abov",8);
            local_358[uVar12].caption[0x10] = 'e';
            local_358[uVar12].caption[0x11] = '\0';
          }
          iVar4 = display_menu(local_358,iVar4,local_658,1,&local_764);
          if (0 < iVar4) {
            iVar4 = local_764;
          }
          if (iVar4 < 1) {
            bVar10 = 0;
            bVar2 = false;
            bVar1 = false;
            poVar16 = (obj *)0x0;
          }
          else {
            bVar2 = (bool)((byte)iVar4 & 1);
            bVar10 = (byte)iVar4 >> 1 & 1;
            bVar1 = true;
          }
        }
        if (!bVar1) {
          return (int)poVar16;
        }
      }
      else {
        cVar3 = yn_function(local_458,"ynq",'n');
        bVar2 = cVar3 == 'y';
        bVar10 = 0;
      }
      if (bVar2 != false) {
        add_valid_menu_class::vmc_count = 0;
        valid_menu_classes[0] = '\0';
        iVar4 = menu_loot(0,current_container,'\0');
        local_76c = local_76c | iVar4 != 0;
      }
    }
    else {
      bVar10 = 0;
      pline("%s",local_558);
    }
    if (invent == (obj *)0x0) {
      pline("You don\'t have anything to put in.");
    }
    else {
      if (flags.menu_style != '\x03') {
        builtin_strncpy(local_458 + 0x10,"ut something in?",0x11);
        builtin_strncpy(local_458,"Do you wish to p",0x10);
        cVar3 = yn_function(local_458,"ynq",'n');
        if (cVar3 == 'm') {
          add_valid_menu_class::vmc_count = 0;
          valid_menu_classes[0] = '\0';
          iVar4 = menu_loot(-2,current_container,'\x01');
          local_76c = local_76c | iVar4 != 0;
        }
        else if (cVar3 != 'n') {
          if (cVar3 != 'y') {
            return local_76c;
          }
          bVar10 = 1;
        }
      }
      if (bVar10 != 0) {
        add_valid_menu_class::vmc_count = 0;
        valid_menu_classes[0] = '\0';
        iVar4 = menu_loot(0,current_container,'\x01');
        local_76c = local_76c | iVar4 != 0;
      }
    }
  }
  else {
    pcVar15 = "You have no hands!";
LAB_00212d7b:
    local_76c = 0;
    pline(pcVar15);
  }
  return local_76c;
}

Assistant:

int use_container(struct obj *obj, int held)
{
	struct obj *curr, *otmp;
	boolean quantum_cat = FALSE,
		loot_out = FALSE, loot_in = FALSE;
	char qbuf[BUFSZ], emptymsg[BUFSZ];
	long loss = 0L;
	int cnt = 0, used = 0,
	    menu_on_request;

	emptymsg[0] = '\0';
	if (nohands(youmonst.data)) {
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}

	if (!cobj_is_magic_chest(obj)) {
	    if (obj->olocked) {
		pline("%s to be locked.", Tobjnam(obj, "seem"));
		if (held) pline("You must put it down to unlock.");
		return 0;
	    } else if (obj->otrapped) {
		if (held) pline("You open %s...", the(xname(obj)));
		chest_trap(obj, HAND, FALSE);
		/* even if the trap fails, you've used up this turn */
		if (multi >= 0) {	/* in case we didn't become paralyzed */
		    nomul(-1, "opening a trapped container");
		    nomovemsg = "";
		}
		return 1;
	    }
	}

	current_container = obj;	/* for use by in/out_container */

	if (!cobj_is_magic_chest(obj) && obj->spe == 1) {
	    observe_quantum_cat(obj);
	    used = 1;
	    quantum_cat = TRUE;	/* for adjusting "it's empty" message */
	}

	/* Count the number of contained objects. Sometimes toss objects if */
	/* a cursed magic bag.						    */
	if (cobj_is_magic_chest(obj))
	    curr = magic_chest_objs;
	else
	    curr = obj->cobj;
	for (; curr; curr = otmp) {
	    otmp = curr->nobj;
	    if (!cobj_is_magic_chest(obj) && Is_mbag(obj) && obj->cursed && !rn2(13)) {
		obj_extract_self(curr);
		loss += mbag_item_gone(held, curr);
		used = 1;
	    } else {
		cnt++;
	    }
	}

	if (loss)	/* magic bag lost some shop goods */
	    pline("You owe %ld %s for lost merchandise.", loss, currency(loss));
	if (!cobj_is_magic_chest(obj))
	    obj->owt = weight(obj);	/* in case any items were lost */

	if (!cnt) {
	    sprintf(emptymsg, "%s is %sempty.",
		    cobj_is_magic_chest(obj) ? "The magic chest" : Yname2(obj),
		    quantum_cat ? "now " : "");
	}

	if (cnt || flags.menu_style == MENU_FULL) {
	    strcpy(qbuf, "Do you want to take something out of ");
	    if (cobj_is_magic_chest(obj)) {
		sprintf(eos(qbuf), "the magic chest?");
	    } else {
		sprintf(eos(qbuf), "%s?",
			safe_qbuf(qbuf, 1, yname(obj), ysimple_name(obj), "it"));
	    }

	    if (flags.menu_style == MENU_FULL) {
		int t;
		char menuprompt[BUFSZ];
		boolean outokay = (cnt != 0);
		boolean inokay = (invent != 0);

		if (!outokay && !inokay) {
		    pline("%s", emptymsg);
		    pline("You don't have anything to put in.");
		    return used;
		}
		menuprompt[0] = '\0';
		if (!cnt) sprintf(menuprompt, "%s ", emptymsg);
		strcat(menuprompt, "Do what?");
		t = in_or_out_menu(menuprompt, current_container, outokay, inokay);
		if (t <= 0) return 0;
		loot_out = (t & 0x01) != 0;
		loot_in  = (t & 0x02) != 0;
	    } else {	/* MENU_PARTIAL */
		loot_out = (yn_function(qbuf, ynqchars, 'n') == 'y');
	    }
	    
	    if (loot_out) {
		add_valid_menu_class(0);	/* reset */
		used |= menu_loot(0, current_container, FALSE) > 0;
	    }
	    
	} else {
	    pline("%s", emptymsg);		/* <whatever> is empty. */
	}

	if (!invent) {
	    /* nothing to put in, but some feedback is necessary */
	    pline("You don't have anything to put in.");
	    return used;
	}
	if (flags.menu_style != MENU_FULL) {
	    sprintf(qbuf, "Do you wish to put something in?");

	    switch (yn_function(qbuf, ynqchars, 'n')) {
		case 'y':
		    loot_in = TRUE;
		    break;
		case 'n':
		    break;
		case 'm':
		    add_valid_menu_class(0);	  /* reset */
		    menu_on_request = -2; /* triggers ALL_CLASSES */
		    used |= menu_loot(menu_on_request, current_container, TRUE) > 0;
		    break;
		case 'q':
		default:
		    return used;
	    }
	}
	/*
	 * Gone: being nice about only selecting food if we know we are
	 * putting things in an ice chest.
	 */
	if (loot_in) {
	    add_valid_menu_class(0);	  /* reset */
	    used |= menu_loot(0, current_container, TRUE) > 0;
	}

	return used;
}